

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

PC * __thiscall
Hpipe::Context::forward(PC *__return_storage_ptr__,Context *this,int type,bool never_ending)

{
  CharItem *item_00;
  bool bVar1;
  size_type sVar2;
  CharItem **ppCVar3;
  reference pCVar4;
  CharEdge *e;
  const_iterator __end3;
  const_iterator __begin3;
  Vec<Hpipe::CharEdge> *__range3;
  CharItem *item;
  undefined1 local_b0 [4];
  uint i;
  PcMaker pm;
  bool never_ending_local;
  int type_local;
  Context *this_local;
  
  pm.orig._3_1_ = never_ending;
  pm.orig._4_4_ = type;
  anon_unknown_7::PcMaker::PcMaker((PcMaker *)local_b0,this);
  item._4_4_ = 0;
  do {
    sVar2 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::size
                      ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
                       this);
    if (sVar2 <= item._4_4_) {
      anon_unknown_7::PcMaker::out(__return_storage_ptr__,(PcMaker *)local_b0);
LAB_001e0581:
      anon_unknown_7::PcMaker::~PcMaker((PcMaker *)local_b0);
      return __return_storage_ptr__;
    }
    ppCVar3 = Vec<const_Hpipe::CharItem_*>::operator[](&this->pos,item._4_4_);
    item_00 = *ppCVar3;
    if (item_00->type == pm.orig._4_4_) {
      __end3 = std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::begin
                         (&(item_00->edges).
                           super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
      e = (CharEdge *)
          std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::end
                    (&(item_00->edges).
                      super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
                                         *)&e), bVar1) {
        pCVar4 = __gnu_cxx::
                 __normal_iterator<const_Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
                 ::operator*(&__end3);
        bVar1 = anon_unknown_7::PcMaker::has((PcMaker *)local_b0,pCVar4->item);
        if (!bVar1) {
          anon_unknown_7::PcMaker::add((PcMaker *)local_b0,pCVar4->item,item._4_4_,true);
          bVar1 = anon_unknown_7::PcMaker::leads_to_ok
                            ((PcMaker *)local_b0,(bool)(pm.orig._3_1_ & 1));
          if (bVar1) {
            anon_unknown_7::PcMaker::out(__return_storage_ptr__,(PcMaker *)local_b0);
            goto LAB_001e0581;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      bVar1 = anon_unknown_7::PcMaker::has((PcMaker *)local_b0,item_00);
      if (!bVar1) {
        anon_unknown_7::PcMaker::add((PcMaker *)local_b0,item_00,item._4_4_,true);
        bVar1 = anon_unknown_7::PcMaker::leads_to_ok((PcMaker *)local_b0,(bool)(pm.orig._3_1_ & 1));
        if (bVar1) {
          anon_unknown_7::PcMaker::out(__return_storage_ptr__,(PcMaker *)local_b0);
          goto LAB_001e0581;
        }
      }
    }
    item._4_4_ = item._4_4_ + 1;
  } while( true );
}

Assistant:

Context::PC Context::forward( int type, bool never_ending ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i < pos.size(); ++i ) {
        const CharItem *item = pos[ i ];
        if ( item->type == type ) {
            for( const CharEdge &e : item->edges ) {
                if ( not pm.has( e.item ) ) {
                    pm.add( e.item, i );
                    if ( pm.leads_to_ok( never_ending ) )
                        return pm.out();
                }
            }
        } else if ( not pm.has( item ) ) {
            pm.add( item, i );
            if ( pm.leads_to_ok( never_ending ) )
                return pm.out();
        }
    }

    return pm.out();
}